

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O0

void __thiscall gpu::shared_device_buffer::resize(shared_device_buffer *this,size_t size)

{
  element_type *this_00;
  cl_mem p_Var1;
  uchar *puVar2;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  Context local_58;
  Type local_34;
  undefined1 local_30 [4];
  Type type;
  Context context;
  size_t size_local;
  shared_device_buffer *this_local;
  
  if (size != this->size_) {
    context.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)size;
    decref(this);
    Context::Context((Context *)local_30);
    local_34 = Context::type((Context *)local_30);
    if (local_34 == TypeOpenCL) {
      Context::cl(&local_58);
      this_00 = std::
                __shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_58);
      p_Var1 = ocl::OpenCLEngine::createBuffer
                         (this_00,1,
                          (size_t)context.data_ref_.
                                  super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi);
      this->data_ = p_Var1;
      std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)&local_58);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_device_buffer.cpp"
                 ,&local_79);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a0,"No GPU context!",&local_a1);
      raiseException(&local_78,0xb9,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    puVar2 = (uchar *)operator_new__(8);
    this->buffer_ = puVar2;
    puVar2 = this->buffer_;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
    incref(this);
    this->type_ = local_34;
    this->size_ = (size_t)context.data_ref_.
                          super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
    this->offset_ = 0;
    Context::~Context((Context *)local_30);
  }
  return;
}

Assistant:

void shared_device_buffer::resize(size_t size)
{
	if (size == size_)
		return;

	decref();

	Context context;
	Context::Type type = context.type();

	switch (type) {
#ifdef CUDA_SUPPORT
	case Context::TypeCUDA:
		CUDA_SAFE_CALL( cudaMalloc(&data_, size) );
		break;
#endif
	case Context::TypeOpenCL:
		data_ = context.cl()->createBuffer(CL_MEM_READ_WRITE, size);
		break;
	default:
		gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}

	buffer_	= new unsigned char [8];
	* (long long *) buffer_ = 0;
	incref();

	type_	= type;
	size_	= size;
	offset_	= 0;
}